

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.hpp
# Opt level: O0

int __thiscall henson::Array::copy(Array *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  void *pvVar1;
  char *__result;
  char *__last;
  variant<void_*,_float_*,_double_*,_int_*,_long_*> *vs;
  size_t i;
  char *char_ptr;
  shared_ptr<std::vector<char,_std::allocator<char>_>_> *in_stack_ffffffffffffffa8;
  Array *in_stack_ffffffffffffffb0;
  replace_ptr *visitor;
  unsigned_long *in_stack_ffffffffffffffd8;
  
  std::make_shared<std::vector<char,std::allocator<char>>,unsigned_long>(in_stack_ffffffffffffffd8);
  std::shared_ptr<std::vector<char,_std::allocator<char>_>_>::operator=
            ((shared_ptr<std::vector<char,_std::allocator<char>_>_> *)in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8);
  std::shared_ptr<std::vector<char,_std::allocator<char>_>_>::~shared_ptr
            ((shared_ptr<std::vector<char,_std::allocator<char>_>_> *)0x2f760d);
  pvVar1 = void_ptr(in_stack_ffffffffffffffb0);
  for (visitor = (replace_ptr *)0x0; visitor < (replace_ptr *)this->count;
      visitor = (replace_ptr *)((long)&visitor->ptr + 1)) {
    __result = (char *)((long)pvVar1 + (long)visitor * this->stride);
    __last = (char *)((long)pvVar1 + this->type + (long)visitor * this->stride);
    std::
    __shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2f7675);
    std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0x2f767d);
    std::copy<char*,char*>((char *)this,__last,__result);
  }
  std::
  __shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2f76c2);
  vs = (variant<void_*,_float_*,_double_*,_int_*,_long_*> *)
       std::vector<char,_std::allocator<char>_>::data
                 ((vector<char,_std::allocator<char>_> *)0x2f76ca);
  mpark::visit<henson::Array::replace_ptr,mpark::variant<void*,float*,double*,int*,long*>&>
            (visitor,vs);
  this->stride = this->type;
  return (int)this;
}

Assistant:

void    copy()
    {
        storage = std::make_shared<std::vector<char>>(count*type);
        char* char_ptr = static_cast<char*>(void_ptr());
        for (size_t i = 0; i < count; ++i)
            std::copy(char_ptr + i*stride, char_ptr + i*stride + type, storage->data() + i*type);
        visit(replace_ptr {storage->data()}, address);
        stride = type;
    }